

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall tetgenio::load_ply(tetgenio *this,char *filebasename)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  FILE *__stream;
  tetgenio *ptVar5;
  polygon *ppVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  tetgenio *ptVar10;
  ulong uVar11;
  char *pcVar12;
  double *pdVar13;
  facet *pfVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  bool bVar19;
  double dVar20;
  int line_count;
  char *bufferp;
  uint local_c74;
  long local_c70;
  long local_c68;
  undefined8 local_c60;
  long local_c58;
  int local_c50;
  uint local_c4c;
  ulong local_c48;
  undefined8 local_c40;
  char infilename [1024];
  char buffer [2048];
  
  line_count = 0;
  strncpy(infilename,filebasename,0x3ff);
  infilename[0x3ff] = '\0';
  if (infilename[0] == '\0') {
    puts("Error:  No filename.");
  }
  else {
    sVar4 = strlen(infilename);
    iVar2 = strcmp(infilename + (sVar4 - 4),".ply");
    if (iVar2 != 0) {
      sVar4 = strlen(infilename);
      builtin_strncpy(infilename + sVar4,".ply",5);
    }
    __stream = fopen(infilename,"r");
    if (__stream != (FILE *)0x0) {
      pcVar17 = "Opening %s.\n";
      local_c60 = 0;
      iVar2 = printf("Opening %s.\n",infilename);
      local_c74 = (uint)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
      local_c68 = 0;
      uVar11 = 0;
      local_c70 = 0;
      uVar15 = 0;
      uVar18 = 0;
      uVar1 = local_c60;
      local_c40 = this;
LAB_0010fa5b:
      local_c60 = uVar1;
      local_c50 = (int)uVar11 * 3;
LAB_0010fa5f:
      local_c58 = (long)local_c50 << 3;
      local_c48 = uVar11;
      do {
        ptVar5 = (tetgenio *)readline((tetgenio *)pcVar17,buffer,(FILE *)__stream,&line_count);
        bufferp = (char *)ptVar5;
        if (ptVar5 == (tetgenio *)0x0) {
LAB_0010ff2c:
          fclose(__stream);
          if (1 < uVar18) {
            printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar18,infilename)
            ;
            return false;
          }
          this->firstnumber = uVar18;
          if ((int)uVar11 == (int)local_c68) {
            if (uVar15 == (uint)local_c70) {
              return true;
            }
            pcVar17 = "Expected %d faces, but read only %d faces in file %s\n";
            uVar11 = (ulong)uVar15;
            lVar16 = local_c70;
          }
          else {
            pcVar17 = "Expected %d vertices, but read only %d vertices in file %s\n";
            uVar11 = uVar11 & 0xffffffff;
            lVar16 = local_c68;
          }
          printf(pcVar17,lVar16,uVar11,infilename);
          return false;
        }
        if ((local_c74 & 1) != 0) {
          pcVar17 = (char *)ptVar5;
          pcVar12 = strstr((char *)ptVar5,"end_header");
          if (((pcVar12 != (char *)0x0) ||
              (pcVar17 = (char *)ptVar5, pcVar12 = strstr((char *)ptVar5,"End_header"),
              pcVar12 != (char *)0x0)) ||
             (pcVar17 = (char *)ptVar5, pcVar12 = strstr((char *)ptVar5,"End_Header"),
             pcVar12 != (char *)0x0)) {
            local_c74 = 0;
            uVar1 = local_c60;
            goto LAB_0010fa5b;
          }
          if ((((int)local_c68 == 0) || ((int)local_c70 == 0)) &&
             ((pcVar17 = (char *)ptVar5, pcVar12 = strstr((char *)ptVar5,"element"),
              pcVar12 != (char *)0x0 ||
              (pcVar12 = strstr((char *)ptVar5,"Element"), pcVar17 = (char *)ptVar5,
              pcVar12 != (char *)0x0)))) {
            ptVar5 = (tetgenio *)findnextfield((tetgenio *)pcVar17,pcVar12);
            bufferp = (char *)ptVar5;
            if ((char)ptVar5->firstnumber == '\0') {
              uVar11 = (ulong)(uint)line_count;
              pcVar17 = "Syntax error reading element type on line%d in file %s\n";
              goto LAB_0010fed4;
            }
            if ((int)local_c68 == 0) {
              ptVar10 = ptVar5;
              pcVar17 = strstr((char *)ptVar5,"vertex");
              if ((pcVar17 == (char *)0x0) &&
                 (pcVar17 = strstr((char *)ptVar5,"Vertex"), ptVar10 = ptVar5,
                 pcVar17 == (char *)0x0)) {
                local_c68 = 0;
                pcVar17 = (char *)ptVar5;
                goto LAB_0010fd49;
              }
              pcVar17 = findnextnumber(ptVar10,pcVar17);
              bufferp = pcVar17;
              if ((char)((tetgenio *)pcVar17)->firstnumber != '\0') {
                local_c68 = strtol(pcVar17,&bufferp,0);
                iVar2 = (int)local_c68;
                if (0 < iVar2) {
                  this->numberofpoints = iVar2;
                  pcVar17 = (char *)(local_c68 * 0x18 & 0x7fffffff8);
                  pdVar13 = (double *)operator_new__((ulong)pcVar17);
                  this->pointlist = pdVar13;
                  uVar18 = iVar2 + 1;
                }
                goto LAB_0010fd49;
              }
              pcVar17 = "Syntax error reading vertex number on line";
LAB_0010fff4:
              printf(pcVar17);
              uVar11 = (ulong)(uint)line_count;
              pcVar17 = " %d in file %s\n";
              goto LAB_0010fed4;
            }
LAB_0010fd49:
            ptVar5 = (tetgenio *)bufferp;
            if ((int)local_c70 == 0) {
              ptVar10 = (tetgenio *)bufferp;
              pcVar17 = strstr(bufferp,"face");
              if ((pcVar17 == (char *)0x0) &&
                 (pcVar17 = strstr((char *)ptVar5,"Face"), ptVar10 = ptVar5, pcVar17 == (char *)0x0)
                 ) {
                local_c70 = 0;
                pcVar17 = (char *)ptVar5;
              }
              else {
                pcVar17 = findnextnumber(ptVar10,pcVar17);
                bufferp = pcVar17;
                if ((char)((tetgenio *)pcVar17)->firstnumber == '\0') {
                  pcVar17 = "Syntax error reading face number on line";
                  goto LAB_0010fff4;
                }
                local_c70 = strtol(pcVar17,&bufferp,0);
                uVar3 = (uint)local_c70;
                if (0 < (int)uVar3) {
                  this->numberoffacets = uVar3;
                  pcVar17 = (char *)((ulong)(uVar3 & 0x7fffffff) << 5);
                  pfVar14 = (facet *)operator_new__((ulong)pcVar17);
                  this->facetlist = pfVar14;
                }
              }
            }
          }
          ptVar5 = (tetgenio *)bufferp;
          bVar19 = (int)local_c60 != 0;
          local_c60 = 1;
          uVar1 = 1;
          if (bVar19) goto LAB_0010fa5b;
          ptVar10 = (tetgenio *)bufferp;
          pcVar12 = strstr(bufferp,"format");
          if (pcVar12 == (char *)0x0) {
            pcVar12 = strstr((char *)ptVar5,"Format");
            local_c60 = 0;
            pcVar17 = (char *)ptVar5;
            ptVar10 = ptVar5;
            uVar1 = local_c60;
            if (pcVar12 == (char *)0x0) goto LAB_0010fa5b;
          }
          ptVar5 = (tetgenio *)findnextfield(ptVar10,pcVar12);
          pcVar17 = (char *)ptVar5;
          bufferp = (char *)ptVar5;
          pcVar12 = strstr((char *)ptVar5,"ascii");
          local_c60 = 1;
          uVar1 = local_c60;
          if (pcVar12 != (char *)0x0) goto LAB_0010fa5b;
          pcVar12 = strstr((char *)ptVar5,"ASCII");
          local_c60 = 1;
          pcVar17 = (char *)ptVar5;
          uVar1 = local_c60;
          if (pcVar12 != (char *)0x0) goto LAB_0010fa5b;
          puts("This routine only reads ascii format of ply files.");
          puts("Hint: You can convert the binary to ascii format by");
          puts("  using the provided ply tools:");
          printf("  ply2ascii < %s > ascii_%s\n",infilename);
          goto LAB_0010fee3;
        }
        if ((int)uVar11 < (int)local_c68) goto LAB_0010fba1;
        if ((int)local_c70 <= (int)uVar15) {
          printf("Found extra text starting at line %d in file %s\n",(ulong)(uint)line_count,
                 infilename);
          goto LAB_0010ff2c;
        }
        pfVar14 = this->facetlist;
        pfVar14[(int)uVar15].polygonlist = (polygon *)0x0;
        pfVar14[(int)uVar15].holelist = (double *)0x0;
        pfVar14[(int)uVar15].numberofholes = 0;
        pfVar14[(int)uVar15].numberofpolygons = 1;
        local_c4c = uVar15;
        ppVar6 = (polygon *)operator_new__(0x10);
        pfVar14[(int)uVar15].polygonlist = ppVar6;
        ppVar6->vertexlist = (int *)0x0;
        ppVar6->numberofvertices = 0;
        uVar7 = strtol((char *)ptVar5,&bufferp,0);
        ppVar6->numberofvertices = (int)uVar7;
        if ((int)uVar7 == 0) {
          printf("Syntax error reading polygon on line %d in file %s\n",(ulong)(uint)line_count,
                 infilename);
          goto LAB_0010fee3;
        }
        pcVar17 = (char *)((long)(uVar7 << 0x20) >> 0x1e);
        if ((long)(uVar7 << 0x20) < 0) {
          pcVar17 = (char *)(tetgenio *)0xffffffffffffffff;
        }
        piVar8 = (int *)operator_new__((ulong)pcVar17);
        uVar11 = local_c48;
        ppVar6->vertexlist = piVar8;
        for (lVar16 = 0; lVar16 < (int)uVar7; lVar16 = lVar16 + 1) {
          pcVar17 = findnextnumber((tetgenio *)pcVar17,bufferp);
          bufferp = pcVar17;
          if ((char)((tetgenio *)pcVar17)->firstnumber == '\0') {
            uVar11 = (ulong)(uint)line_count;
            pcVar17 = "Syntax error reading polygon on line %d in file %s\n";
            goto LAB_0010fed4;
          }
          lVar9 = strtol(pcVar17,&bufferp,0);
          uVar15 = (uint)lVar9;
          ppVar6->vertexlist[lVar16] = uVar15;
          if ((int)uVar18 < (int)uVar15) {
            uVar15 = uVar18;
          }
          uVar18 = uVar15;
          uVar7 = (ulong)(uint)ppVar6->numberofvertices;
        }
        uVar15 = local_c4c + 1;
        this = local_c40;
      } while( true );
    }
    printf("Error:  Unable to open file %s\n",infilename);
  }
  return false;
LAB_0010fba1:
  local_c58 = local_c58 + (long)this->pointlist;
  for (lVar16 = 0; bufferp = (char *)ptVar5, lVar16 != 3; lVar16 = lVar16 + 1) {
    if ((char)ptVar5->firstnumber == '\0') {
      uVar11 = (ulong)(uint)line_count;
      pcVar17 = "Syntax error reading vertex coords on line %d in file %s\n";
LAB_0010fed4:
      printf(pcVar17,uVar11,infilename);
LAB_0010fee3:
      fclose(__stream);
      return false;
    }
    dVar20 = strtod((char *)ptVar5,&bufferp);
    *(double *)(local_c58 + lVar16 * 8) = dVar20;
    ptVar10 = (tetgenio *)findnextnumber(ptVar5,bufferp);
    pcVar17 = (char *)ptVar5;
    ptVar5 = ptVar10;
  }
  uVar11 = (ulong)((int)local_c48 + 1);
  local_c50 = local_c50 + 3;
  goto LAB_0010fa5f;
}

Assistant:

bool tetgenio::load_ply(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int endheader = 0, format = 0;
  int nverts = 0, iverts = 0;
  int nfaces = 0, ifaces = 0;
  int line_count = 0, i;

  // Default, the ply file's index is from '0'. We check it by remembering the
  //   smallest index we found in the file. It should be either 0 or 1.
  int smallestidx = 0; 

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".ply") != 0) {
    strcat(infilename, ".ply");
  }

  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (!endheader) {
      // Find if it is the keyword "end_header".
      str = strstr(bufferp, "end_header");
      // strstr() is case sensitive.
      if (!str) str = strstr(bufferp, "End_header");
      if (!str) str = strstr(bufferp, "End_Header");
      if (str) {
        // This is the end of the header section.
        endheader = 1; 
        continue;
      }
      // Parse the number of vertices and the number of faces.
      if (nverts == 0 || nfaces == 0) {
        // Find if it si the keyword "element".
        str = strstr(bufferp, "element");
        if (!str) str = strstr(bufferp, "Element");
        if (str) {
          bufferp = findnextfield(str);
          if (*bufferp == '\0') {
            printf("Syntax error reading element type on line%d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          if (nverts == 0) {
            // Find if it is the keyword "vertex".
            str = strstr(bufferp, "vertex");
            if (!str) str = strstr(bufferp, "Vertex");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading vertex number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nverts = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nverts > 0) {
                numberofpoints = nverts;
                pointlist = new REAL[nverts * 3];
                smallestidx = nverts + 1; // A big enough index.
              }
            }
          }
          if (nfaces == 0) {
            // Find if it is the keyword "face".
            str = strstr(bufferp, "face");
            if (!str) str = strstr(bufferp, "Face");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading face number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nfaces = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nfaces > 0) {        
                numberoffacets = nfaces;
                facetlist = new tetgenio::facet[nfaces];
              }
            }
          }
        } // It is not the string "element". 
      }
      if (format == 0) {
        // Find the keyword "format".
        str = strstr(bufferp, "format");
        if (!str) str = strstr(bufferp, "Format");
        if (str) {
          format = 1;
          bufferp = findnextfield(str);
          // Find if it is the string "ascii".
          str = strstr(bufferp, "ascii");
          if (!str) str = strstr(bufferp, "ASCII");
          if (!str) {
            printf("This routine only reads ascii format of ply files.\n");
            printf("Hint: You can convert the binary to ascii format by\n");
            printf("  using the provided ply tools:\n");
            printf("  ply2ascii < %s > ascii_%s\n", infilename, infilename);
            fclose(fp);
            return false;
          }
        }
      }
    } else if (iverts < nverts) {
      // Read vertex coordinates
      coord = &pointlist[iverts * 3];
      for (i = 0; i < 3; i++) {
        if (*bufferp == '\0') {
          printf("Syntax error reading vertex coords on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        coord[i] = (REAL) strtod(bufferp, &bufferp);
        bufferp = findnextnumber(bufferp);
      }
      iverts++;
    } else if (ifaces < nfaces) {
      // Get next face
      f = &facetlist[ifaces];
      init(f);      
      // In .off format, each facet has one polygon, no hole.
      f->numberofpolygons = 1;
      f->polygonlist = new tetgenio::polygon[1];
      p = &f->polygonlist[0];
      init(p);
      // Read the number of vertices, it should be greater than 0.
      p->numberofvertices = (int) strtol(bufferp, &bufferp, 0);
      if (p->numberofvertices == 0) {
        printf("Syntax error reading polygon on line %d in file %s\n",
               line_count, infilename);
        fclose(fp);
        return false;
      }
      // Allocate memory for face vertices
      p->vertexlist = new int[p->numberofvertices];
      for (i = 0; i < p->numberofvertices; i++) {
        bufferp = findnextnumber(bufferp);
        if (*bufferp == '\0') {
          printf("Syntax error reading polygon on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        p->vertexlist[i] = (int) strtol(bufferp, &bufferp, 0);
        if (p->vertexlist[i] < smallestidx) {
          smallestidx = p->vertexlist[i];
        }
      }
      ifaces++;
    } else {
      // Should never get here
      printf("Found extra text starting at line %d in file %s\n", line_count,
             infilename);
      break;
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  if (iverts != nverts) {
    printf("Expected %d vertices, but read only %d vertices in file %s\n",
           nverts, iverts, infilename);
    return false;
  }
  if (ifaces != nfaces) {
    printf("Expected %d faces, but read only %d faces in file %s\n",
           nfaces, ifaces, infilename);
    return false;
  }

  return true;
}